

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

bool __thiscall
Graph::containsPathToNode
          (Graph *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *visitedNodes,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *loops)

{
  bool bVar1;
  __type _Var2;
  reference pCVar3;
  string *psVar4;
  size_type sVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copyVisited;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  int local_b0;
  undefined1 local_a0 [8];
  Connection connection;
  iterator __end1;
  iterator __begin1;
  vector<Connection,_std::allocator<Connection>_> *__range1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *loops_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *visitedNodes_local;
  Graph *this_local;
  
  __end1 = std::vector<Connection,_std::allocator<Connection>_>::begin(&this->connections);
  connection.label.field_2._8_8_ =
       std::vector<Connection,_std::allocator<Connection>_>::end(&this->connections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                                     *)((long)&connection.label.field_2 + 8)), bVar1) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
             ::operator*(&__end1);
    Connection::Connection((Connection *)local_a0,pCVar3);
    psVar4 = Connection::getName_from_abi_cxx11_((Connection *)local_a0);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(visitedNodes);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](visitedNodes,sVar5 - 1);
    _Var2 = std::operator==(psVar4,pvVar6);
    if (_Var2) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](visitedNodes,0);
      psVar4 = Connection::getName_to_abi_cxx11_((Connection *)local_a0);
      _Var2 = std::operator==(pvVar6,psVar4);
      if (_Var2) {
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::push_back(loops,visitedNodes);
        this_local._7_1_ = 1;
        local_b0 = 1;
      }
      else {
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(visitedNodes);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(visitedNodes);
        psVar4 = Connection::getName_to_abi_cxx11_((Connection *)local_a0);
        local_b8 = std::
                   find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                             (__first._M_current,__last._M_current,psVar4);
        copyVisited.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(visitedNodes);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&copyVisited.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8,visitedNodes);
          psVar4 = Connection::getName_to_abi_cxx11_((Connection *)local_a0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_e8,
                     psVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_100,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8);
          containsPathToNode(this,&local_100,loops);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_100);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8);
          goto LAB_001257c3;
        }
        this_local._7_1_ = 0;
        local_b0 = 1;
      }
    }
    else {
LAB_001257c3:
      local_b0 = 0;
    }
    Connection::~Connection((Connection *)local_a0);
    if (local_b0 != 0) goto LAB_00125809;
    __gnu_cxx::
    __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
    operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_00125809:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Graph::containsPathToNode(std::vector<std::string> visitedNodes,
                               std::vector<std::vector<std::string>> &loops) {
    for (auto connection: connections) {
        if (connection.getName_from() == visitedNodes[visitedNodes.size() - 1]) {
            if (visitedNodes[0] == connection.getName_to()) {
                // Found yah
                loops.push_back(visitedNodes);
                return true;
            } else if (std::find(visitedNodes.begin(), visitedNodes.end(), connection.getName_to()) !=
                       visitedNodes.end()) {
                return false; // Just another cycle, not the one we're searching for
            } else {
                std::vector<std::string> copyVisited = visitedNodes;
                copyVisited.emplace_back(connection.getName_to());
                containsPathToNode(copyVisited, loops);
            }
        }
    }
    return false;
}